

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

void __thiscall capnp::compiler::Compiler::Node::Content::~Content(Content *this)

{
  Content *this_local;
  
  kj::Array<capnp::schema::Node::SourceInfo::Reader>::~Array(&this->sourceInfo);
  kj::Array<capnp::schema::Node::Reader>::~Array(&this->auxSchemas);
  kj::Maybe<capnp::schema::Node::Reader>::~Maybe(&this->finalSchema);
  kj::Maybe<capnp::Schema>::~Maybe(&this->bootstrapSchema);
  std::
  multimap<kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias,_std::nullptr_t>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias,_std::nullptr_t>_>_>_>
  ::~multimap(&this->aliases);
  kj::Vector<capnp::compiler::Compiler::Node_*>::~Vector(&this->orderedNestedNodes);
  std::
  multimap<kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_>_>_>
  ::~multimap(&this->nestedNodes);
  return;
}

Assistant:

inline Content(): state(STUB) {}